

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O2

int lrandomkey(lua_State *L)

{
  long lVar1;
  long lVar2;
  byte bVar3;
  char tmp [8];
  
  bVar3 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    lVar1 = random();
    tmp[lVar2] = (byte)lVar1;
    bVar3 = bVar3 ^ (byte)lVar1;
  }
  if (bVar3 == 0) {
    tmp[0] = tmp[0] | 1;
  }
  lua_pushlstring(L,tmp,8);
  return 1;
}

Assistant:

static int
lrandomkey(lua_State *L) {
	char tmp[8];
	int i;
	char x = 0;
	for (i=0;i<8;i++) {
		tmp[i] = random() & 0xff;
		x ^= tmp[i];
	}
	if (x==0) {
		tmp[0] |= 1;	// avoid 0
	}
	lua_pushlstring(L, tmp, 8);
	return 1;
}